

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

cmGeneratorExpressionNode * cmGeneratorExpressionNode::GetNode(string *identifier)

{
  int iVar1;
  mapped_type *ppcVar2;
  iterator iVar3;
  cmGeneratorExpressionNode *pcVar4;
  allocator local_29;
  key_type local_28;
  
  if (GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_);
    if (iVar1 != 0) {
      GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header.
      _M_header._M_color = _S_red;
      GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header.
      _M_header._M_parent = (_Base_ptr)0x0;
      GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header.
      _M_header._M_left =
           &GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_._M_t._M_impl.
            super__Rb_tree_header._M_header;
      GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header.
      _M_header._M_right =
           &GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_._M_t._M_impl.
            super__Rb_tree_header._M_header;
      GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header.
      _M_node_count = 0;
      __cxa_atexit(std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
                   ::~map,&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_);
    }
  }
  if (GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header.
      _M_node_count == 0) {
    std::__cxx11::string::string((string *)&local_28,"0",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &zeroNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"1",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &oneNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"AND",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &andNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"OR",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &orNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"NOT",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &notNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"C_COMPILER_ID",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = (mapped_type)&cCompilerIdNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"CXX_COMPILER_ID",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = (mapped_type)&cxxCompilerIdNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"VERSION_GREATER",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &versionGreaterNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"VERSION_LESS",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &versionLessNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"VERSION_EQUAL",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &versionEqualNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"C_COMPILER_VERSION",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = (mapped_type)&cCompilerVersionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"CXX_COMPILER_VERSION",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = (mapped_type)&cxxCompilerVersionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"PLATFORM_ID",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &platformIdNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"COMPILE_FEATURES",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &compileFeaturesNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"CONFIGURATION",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &configurationNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"CONFIG",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &configurationTestNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"TARGET_FILE",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = (mapped_type)&targetNodeGroup;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"TARGET_LINKER_FILE",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = (mapped_type)&targetLinkerNodeGroup;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"TARGET_SONAME_FILE",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = (mapped_type)&targetSoNameNodeGroup;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"TARGET_PDB_FILE",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = (mapped_type)&targetPdbNodeGroup;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"TARGET_FILE_NAME",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &targetNodeGroup.FileName.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"TARGET_LINKER_FILE_NAME",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &targetLinkerNodeGroup.FileName.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"TARGET_SONAME_FILE_NAME",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &targetSoNameNodeGroup.FileName.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"TARGET_PDB_FILE_NAME",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &targetPdbNodeGroup.FileName.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"TARGET_FILE_DIR",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &targetNodeGroup.FileDir.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"TARGET_LINKER_FILE_DIR",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &targetLinkerNodeGroup.FileDir.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"TARGET_SONAME_FILE_DIR",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &targetSoNameNodeGroup.FileDir.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"TARGET_PDB_FILE_DIR",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &targetPdbNodeGroup.FileDir.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"STREQUAL",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &strEqualNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"EQUAL",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &equalNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"LOWER_CASE",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &lowerCaseNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"UPPER_CASE",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &upperCaseNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"MAKE_C_IDENTIFIER",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &makeCIdentifierNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"BOOL",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &boolNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"ANGLE-R",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &angle_rNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"COMMA",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &commaNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"SEMICOLON",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &semicolonNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"TARGET_PROPERTY",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &targetPropertyNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"TARGET_NAME",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &targetNameNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"TARGET_OBJECTS",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &targetObjectsNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"TARGET_POLICY",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &targetPolicyNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"BUILD_INTERFACE",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &buildInterfaceNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"INSTALL_INTERFACE",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &installInterfaceNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"INSTALL_PREFIX",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &installPrefixNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"JOIN",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &joinNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"LINK_ONLY",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &linkOnlyNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"COMPILE_LANGUAGE",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &languageNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"SHELL_PATH",&local_29);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_28);
    *ppcVar2 = &shellPathNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_28);
  }
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
          ::find(&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_._M_t,identifier);
  if ((_Rb_tree_header *)iVar3._M_node ==
      &GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header)
  {
    pcVar4 = (cmGeneratorExpressionNode *)0x0;
  }
  else {
    pcVar4 = *(cmGeneratorExpressionNode **)(iVar3._M_node + 2);
  }
  return pcVar4;
}

Assistant:

const cmGeneratorExpressionNode*
cmGeneratorExpressionNode::GetNode(const std::string &identifier)
{
  typedef std::map<std::string, const cmGeneratorExpressionNode*> NodeMap;
  static NodeMap nodeMap;
  if (nodeMap.empty())
    {
    nodeMap["0"] = &zeroNode;
    nodeMap["1"] = &oneNode;
    nodeMap["AND"] = &andNode;
    nodeMap["OR"] = &orNode;
    nodeMap["NOT"] = &notNode;
    nodeMap["C_COMPILER_ID"] = &cCompilerIdNode;
    nodeMap["CXX_COMPILER_ID"] = &cxxCompilerIdNode;
    nodeMap["VERSION_GREATER"] = &versionGreaterNode;
    nodeMap["VERSION_LESS"] = &versionLessNode;
    nodeMap["VERSION_EQUAL"] = &versionEqualNode;
    nodeMap["C_COMPILER_VERSION"] = &cCompilerVersionNode;
    nodeMap["CXX_COMPILER_VERSION"] = &cxxCompilerVersionNode;
    nodeMap["PLATFORM_ID"] = &platformIdNode;
    nodeMap["COMPILE_FEATURES"] = &compileFeaturesNode;
    nodeMap["CONFIGURATION"] = &configurationNode;
    nodeMap["CONFIG"] = &configurationTestNode;
    nodeMap["TARGET_FILE"] = &targetNodeGroup.File;
    nodeMap["TARGET_LINKER_FILE"] = &targetLinkerNodeGroup.File;
    nodeMap["TARGET_SONAME_FILE"] = &targetSoNameNodeGroup.File;
    nodeMap["TARGET_PDB_FILE"] = &targetPdbNodeGroup.File;
    nodeMap["TARGET_FILE_NAME"] = &targetNodeGroup.FileName;
    nodeMap["TARGET_LINKER_FILE_NAME"] = &targetLinkerNodeGroup.FileName;
    nodeMap["TARGET_SONAME_FILE_NAME"] = &targetSoNameNodeGroup.FileName;
    nodeMap["TARGET_PDB_FILE_NAME"] = &targetPdbNodeGroup.FileName;
    nodeMap["TARGET_FILE_DIR"] = &targetNodeGroup.FileDir;
    nodeMap["TARGET_LINKER_FILE_DIR"] = &targetLinkerNodeGroup.FileDir;
    nodeMap["TARGET_SONAME_FILE_DIR"] = &targetSoNameNodeGroup.FileDir;
    nodeMap["TARGET_PDB_FILE_DIR"] = &targetPdbNodeGroup.FileDir;
    nodeMap["STREQUAL"] = &strEqualNode;
    nodeMap["EQUAL"] = &equalNode;
    nodeMap["LOWER_CASE"] = &lowerCaseNode;
    nodeMap["UPPER_CASE"] = &upperCaseNode;
    nodeMap["MAKE_C_IDENTIFIER"] = &makeCIdentifierNode;
    nodeMap["BOOL"] = &boolNode;
    nodeMap["ANGLE-R"] = &angle_rNode;
    nodeMap["COMMA"] = &commaNode;
    nodeMap["SEMICOLON"] = &semicolonNode;
    nodeMap["TARGET_PROPERTY"] = &targetPropertyNode;
    nodeMap["TARGET_NAME"] = &targetNameNode;
    nodeMap["TARGET_OBJECTS"] = &targetObjectsNode;
    nodeMap["TARGET_POLICY"] = &targetPolicyNode;
    nodeMap["BUILD_INTERFACE"] = &buildInterfaceNode;
    nodeMap["INSTALL_INTERFACE"] = &installInterfaceNode;
    nodeMap["INSTALL_PREFIX"] = &installPrefixNode;
    nodeMap["JOIN"] = &joinNode;
    nodeMap["LINK_ONLY"] = &linkOnlyNode;
    nodeMap["COMPILE_LANGUAGE"] = &languageNode;
    nodeMap["SHELL_PATH"] = &shellPathNode;
    }
  NodeMap::const_iterator i = nodeMap.find(identifier);
  if (i == nodeMap.end())
    {
    return 0;
    }
  return i->second;
}